

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

double __thiscall Mat::sqrt(Mat *this,double __x)

{
  pointer p_Var1;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  int *in_RSI;
  ulong uVar2;
  ulong uVar3;
  double extraout_XMM0_Qa;
  double __x_00;
  
  Mat(this,*in_RSI,in_RSI[1]);
  uVar2 = 0;
  uVar3 = (ulong)(uint)(in_RSI[1] * *in_RSI);
  if (in_RSI[1] * *in_RSI < 1) {
    uVar3 = uVar2;
  }
  __x_00 = extraout_XMM0_Qa;
  for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    __x_00 = Constant::Util::sqrt(*(Util **)(*(long *)(in_RSI + 4) + uVar2),__x_00);
    p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)p_Var1 + uVar2 + 8) = extraout_RDX;
    *(undefined8 *)((long)p_Var1 + uVar2) = extraout_RAX;
  }
  return __x_00;
}

Assistant:

Mat Mat::sqrt() {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = Constant::Util::sqrt(val[i]);
    }
    return ret;
}